

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1558.c
# Opt level: O2

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long protocol;
  
  protocol = 0;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1558.c"
                    ,0x23);
      iVar2 = 0x7c;
    }
    else {
      iVar2 = curl_easy_setopt(lVar5,0x2712,URL);
      uVar1 = _stderr;
      if (iVar2 == 0) {
        iVar2 = curl_easy_perform(lVar5);
        uVar1 = _stderr;
        if (iVar2 == 0) {
          iVar2 = 0;
          iVar3 = curl_easy_getinfo(lVar5,0x200030,&protocol);
          uVar1 = _stderr;
          if (iVar3 == 0) {
            curl_mprintf("Protocol: %x\n",protocol);
          }
          else {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"curl_easy_getinfo() returned %d (%s)\n",iVar3,uVar4);
            iVar2 = iVar3;
          }
        }
        else {
          uVar4 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"curl_easy_perform() returned %d (%s)\n",iVar2,uVar4);
        }
      }
      else {
        uVar4 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1558.c"
                      ,0x25,iVar2,uVar4);
      }
    }
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1558.c"
                  ,0x22,iVar2,uVar4);
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURLcode res = 0;
  CURL *curl = NULL;
  long protocol = 0;

  global_init(CURL_GLOBAL_ALL);
  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "curl_easy_perform() returned %d (%s)\n",
            res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "curl_easy_getinfo() returned %d (%s)\n",
            res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  printf("Protocol: %x\n", protocol);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return 0;

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res; /* return the final return code */
}